

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.cc
# Opt level: O0

void absl::lts_20250127::container_internal::ConvertDeletedToEmptyAndFullToDeleted
               (ctrl_t *ctrl,size_t capacity)

{
  size_t __src;
  bool bVar1;
  ctrl_t *__dest;
  size_t __n;
  GroupSse2Impl local_38;
  ctrl_t *local_20;
  ctrl_t *pos;
  size_t capacity_local;
  ctrl_t *ctrl_local;
  
  pos = (ctrl_t *)capacity;
  capacity_local = (size_t)ctrl;
  if (ctrl[capacity] != kSentinel) {
    __assert_fail("ctrl[capacity] == ctrl_t::kSentinel",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                  ,0x9e,
                  "void absl::container_internal::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *, size_t)"
                 );
  }
  bVar1 = IsValidCapacity(capacity);
  if (!bVar1) {
    __assert_fail("IsValidCapacity(capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/raw_hash_set.cc"
                  ,0x9f,
                  "void absl::container_internal::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *, size_t)"
                 );
  }
  for (local_20 = (ctrl_t *)capacity_local; __src = capacity_local, local_20 < pos + capacity_local;
      local_20 = local_20 + 0x10) {
    GroupSse2Impl::GroupSse2Impl(&local_38,local_20);
    GroupSse2Impl::ConvertSpecialToEmptyAndFullToDeleted(&local_38,local_20);
  }
  __dest = pos + capacity_local + 1;
  __n = NumClonedBytes();
  memcpy(__dest,(void *)__src,__n);
  pos[capacity_local] = kSentinel;
  return;
}

Assistant:

void ConvertDeletedToEmptyAndFullToDeleted(ctrl_t* ctrl, size_t capacity) {
  assert(ctrl[capacity] == ctrl_t::kSentinel);
  assert(IsValidCapacity(capacity));
  for (ctrl_t* pos = ctrl; pos < ctrl + capacity; pos += Group::kWidth) {
    Group{pos}.ConvertSpecialToEmptyAndFullToDeleted(pos);
  }
  // Copy the cloned ctrl bytes.
  std::memcpy(ctrl + capacity + 1, ctrl, NumClonedBytes());
  ctrl[capacity] = ctrl_t::kSentinel;
}